

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O2

void __thiscall
Web_Constraint::Changed
          (Web_Constraint *this,Am_Slot *slot_changed,Am_Constraint *changing_constraint)

{
  Input_Port *new_port;
  bool temp_changed;
  Am_Value temp_value;
  bool local_29;
  Am_Value local_28;
  
  if ((Web_Constraint *)changing_constraint != this) {
    new_port = Input_Port::Search(this->owner->in_list,slot_changed);
    if (new_port != (Input_Port *)0x0) {
      if (new_port->changed == true) {
        local_28.type = 0;
        local_28.value.wrapper_value = (Am_Wrapper *)0x0;
        Am_Web_Data::Validate(this->owner,slot_changed,&local_28,&local_29);
        Am_Value::~Am_Value(&local_28);
      }
      Am_Web_Data::Enqueue(this->owner,new_port);
      Am_Web_Data::Invalidate(this->owner,slot_changed);
    }
  }
  return;
}

Assistant:

void
Web_Constraint::Changed(const Am_Slot &slot_changed,
                        Am_Constraint *changing_constraint)
{
  if (changing_constraint == this)
    return;
  Input_Port *port = owner->in_list->Search(slot_changed);
  if (!port)
    return;
  if (port->changed) {
    Am_Value temp_value;
    bool temp_changed;
    owner->Validate(slot_changed, temp_value, temp_changed);
  }
  owner->Enqueue(port);
  /*if (!slot_changed)*/
  owner->Invalidate(slot_changed);
}